

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_rotate(lua_State *L,int idx,int n)

{
  StkId to;
  StkId from;
  StkId local_38;
  StkId m;
  StkId t;
  StkId p;
  int n_local;
  int idx_local;
  lua_State *L_local;
  
  to = (StkId)((L->top).offset + -0x10);
  from = index2stack(L,idx);
  if (n < 0) {
    local_38 = from + (-1 - (long)n);
  }
  else {
    local_38 = to + -(long)n;
  }
  reverse(L,from,local_38);
  reverse(L,local_38 + 1,to);
  reverse(L,from,to);
  return;
}

Assistant:

LUA_API void lua_rotate (lua_State *L, int idx, int n) {
  StkId p, t, m;
  lua_lock(L);
  t = L->top.p - 1;  /* end of stack segment being rotated */
  p = index2stack(L, idx);  /* start of segment */
  api_check(L, (n >= 0 ? n : -n) <= (t - p + 1), "invalid 'n'");
  m = (n >= 0 ? t - n : p - n - 1);  /* end of prefix */
  reverse(L, p, m);  /* reverse the prefix with length 'n' */
  reverse(L, m + 1, t);  /* reverse the suffix */
  reverse(L, p, t);  /* reverse the entire segment */
  lua_unlock(L);
}